

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

Bool CheckMissingStyleSheets(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  TidyAttrId TVar2;
  Dict *pDVar3;
  int iVar4;
  Bool BVar5;
  TidyDocImpl *doc_00;
  AttVal *pAVar6;
  bool bVar7;
  
  doc_00 = (TidyDocImpl *)(doc->root).content;
  if (doc_00 == (TidyDocImpl *)0x0) {
    return no;
  }
  do {
    pDVar3 = (doc_00->root).tag;
    bVar7 = true;
    if (pDVar3 != (Dict *)0x0) {
      TVar1 = pDVar3->id;
      if ((int)TVar1 < 0x24) {
        if (TVar1 == TidyTag_BASEFONT) {
          bVar7 = false;
        }
      }
      else {
        if (TVar1 == TidyTag_FONT) {
          return yes;
        }
        if (TVar1 == TidyTag_LINK) {
          return yes;
        }
        if (TVar1 == TidyTag_STYLE) {
          return yes;
        }
      }
    }
    if (bVar7) {
      for (pAVar6 = (doc_00->root).attributes; pAVar6 != (AttVal *)0x0; pAVar6 = pAVar6->next) {
        bVar7 = true;
        if (pAVar6->dict != (Attribute *)0x0) {
          TVar2 = pAVar6->dict->id;
          if ((int)TVar2 < 0x91) {
            if (TVar2 == TidyAttr_REL) {
              if (pAVar6->value != (ctmbstr)0x0) {
                node = (Node *)0x15e45a;
                iVar4 = prvTidytmbstrcasecmp(pAVar6->value,"stylesheet");
                bVar7 = iVar4 != 0;
              }
            }
            else {
              if (TVar2 == TidyAttr_ALINK) {
                return yes;
              }
              if (TVar2 == TidyAttr_LINK) {
                return yes;
              }
            }
          }
          else {
            if (TVar2 == TidyAttr_STYLE) {
              return yes;
            }
            if (TVar2 == TidyAttr_TEXT) {
              return yes;
            }
            if (TVar2 == TidyAttr_VLINK) {
              return yes;
            }
          }
        }
        if (!bVar7) break;
      }
    }
    if (!bVar7) {
      return yes;
    }
    BVar5 = CheckMissingStyleSheets(doc_00,node);
    if (BVar5 != no) {
      return BVar5;
    }
    doc_00 = (TidyDocImpl *)(doc_00->root).next;
    if (doc_00 == (TidyDocImpl *)0x0) {
      return no;
    }
  } while( true );
}

Assistant:

static Bool CheckMissingStyleSheets( TidyDocImpl* doc, Node* node )
{
    AttVal* av;
    Node* content;
    Bool sspresent = no;

    for ( content = node->content;
          !sspresent && content != NULL;
          content = content->next )
    {
        sspresent = ( nodeIsLINK(content)  ||
                      nodeIsSTYLE(content) ||
                      nodeIsFONT(content)  ||
                      nodeIsBASEFONT(content) );

        for ( av = content->attributes;
              !sspresent && av != NULL;
              av = av->next )
        {
            sspresent = ( attrIsSTYLE(av) || attrIsTEXT(av)  ||
                          attrIsVLINK(av) || attrIsALINK(av) ||
                          attrIsLINK(av) );

            if ( !sspresent && attrIsREL(av) )
            {
                sspresent = AttrValueIs(av, "stylesheet");
            }
        }

        if ( ! sspresent )
            sspresent = CheckMissingStyleSheets( doc, content );
    }
    return sspresent;
}